

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuidpp.cpp
# Opt level: O3

void cpuidpp::anon_unknown_2::ExtractChar<unsigned_int,_4UL,_4UL>::fill(uint value,string *out)

{
  std::__cxx11::string::_M_replace_aux((ulong)out,out->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_replace_aux((ulong)out,out->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_replace_aux((ulong)out,out->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_replace_aux((ulong)out,out->_M_string_length,0,'\x01');
  return;
}

Assistant:

static void fill(T value, std::string& out)
    {
        constexpr std::size_t Index = N - 1;

        ExtractChar<T, N - 1, Size>::fill(value, out);

        const auto ch = static_cast<char>((value >> (Index * 8)) & 0xff);
        out.append(1, ch);
    }